

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexReaderCache::logRecentlyUsed(PtexReaderCache *this,PtexCachedReader *reader)

{
  int iVar1;
  MruList *pMVar2;
  
  while( true ) {
    pMVar2 = this->_mruList;
    LOCK();
    iVar1 = pMVar2->next;
    pMVar2->next = pMVar2->next + 1;
    UNLOCK();
    if (iVar1 + 1 < 0x33) break;
    do {
      processMru(this);
    } while (0x31 < this->_mruList->next);
  }
  pMVar2->files[iVar1] = reader;
  return;
}

Assistant:

void PtexReaderCache::logRecentlyUsed(PtexCachedReader* reader)
{
    while (1) {
        MruList* mruList = _mruList;
        int slot = AtomicIncrement(&mruList->next)-1;
        if (slot < numMruFiles) {
            mruList->files[slot] = reader;
            return;
        }
        // no mru slot available, process mru list and try again
        do processMru();
        while (_mruList->next >= numMruFiles);
    }
}